

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O3

void __thiscall
pbrt::SurfaceInteraction::SetShadingGeometry
          (SurfaceInteraction *this,Normal3f ns,Vector3f dpdus,Vector3f dpdvs,Normal3f dndus,
          Normal3f dndvs,bool orientationIsAuthoritative)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  float fVar7;
  bool bVar8;
  undefined3 in_register_00000031;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar11 [16];
  
  auVar21._8_56_ = dndus._8_56_;
  auVar21._0_8_ = dndus.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar20._4_60_ = dpdvs._12_60_;
  auVar20._0_4_ = dpdvs.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._8_56_ = dpdvs._8_56_;
  auVar18._0_8_ = dpdvs.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar16._4_60_ = dpdus._12_60_;
  auVar16._0_4_ = dpdus.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._8_56_ = dpdus._8_56_;
  auVar14._0_8_ = dpdus.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._4_60_ = ns._12_60_;
  auVar13._0_4_ = ns.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar12._8_56_ = ns._8_56_;
  auVar12._0_8_ = ns.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  auVar11 = auVar12._0_16_;
  uVar3 = vmovlps_avx(auVar11);
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar3;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z = auVar13._0_4_;
  auVar6 = vmovshdup_avx(auVar11);
  fVar1 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  uVar4._0_4_ = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  uVar4._4_4_ = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar4;
  fVar7 = fVar1 * auVar13._0_4_;
  auVar10._8_4_ = 0x80000000;
  auVar10._0_8_ = 0x8000000080000000;
  auVar10._12_4_ = 0x80000000;
  auVar9 = vxorps_avx512vl(ZEXT416((uint)fVar7),auVar10);
  auVar10 = vmovshdup_avx(auVar22);
  if (CONCAT31(in_register_00000031,orientationIsAuthoritative) == 0) {
    auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar1),auVar13._0_16_,auVar9);
    auVar6 = vfmadd213ss_fma(auVar10,auVar6,ZEXT416((uint)fVar7));
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ + auVar9._0_4_)),auVar22,auVar11);
    if (auVar6._0_4_ < 0.0) {
      auVar11._0_8_ = auVar12._0_8_ ^ 0x8000000080000000;
      auVar11._8_4_ = ns.super_Tuple3<pbrt::Normal3,_float>.z ^ 0x80000000;
      auVar11._12_4_ = ns._12_4_ ^ 0x80000000;
    }
    uVar3 = vcmpss_avx512f(auVar6,ZEXT816(0) << 0x20,1);
    bVar8 = (bool)((byte)uVar3 & 1);
    uVar3 = vmovlps_avx(auVar11);
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar3;
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
    (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
         (float)((uint)bVar8 * (int)-auVar13._0_4_ + (uint)!bVar8 * (int)auVar13._0_4_);
  }
  else {
    auVar9 = vfmadd213ss_fma(auVar13._0_16_,ZEXT416((uint)fVar1),auVar9);
    auVar6 = vfmadd213ss_fma(auVar6,auVar10,ZEXT416((uint)fVar7));
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ + auVar9._0_4_)),auVar22,auVar11);
    if (auVar6._0_4_ < 0.0) {
      auVar9._0_8_ = uVar4 ^ 0x8000000080000000;
      auVar9._8_4_ = 0x80000000;
      auVar9._12_4_ = 0x80000000;
    }
    else {
      uVar2 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar5 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
      auVar9._4_4_ = uVar5;
      auVar9._0_4_ = uVar2;
      auVar9._8_8_ = 0;
    }
    uVar3 = vcmpss_avx512f(auVar6,ZEXT816(0),1);
    bVar8 = (bool)((byte)uVar3 & 1);
    uVar3 = vmovlps_avx(auVar9);
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar3;
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y =
         (float)(int)((ulong)uVar3 >> 0x20);
    (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z =
         (float)((uint)bVar8 * (int)-fVar1 + (uint)!bVar8 * (int)fVar1);
  }
  uVar3 = vmovlps_avx(auVar14._0_16_);
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z = auVar16._0_4_;
  auVar9 = auVar18._0_16_;
  uVar3 = vmovlps_avx(auVar9);
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = auVar20._0_4_;
  uVar3 = vmovlps_avx(auVar21._0_16_);
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar3;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar3 >> 0x20);
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z =
       dndus.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar10 = _DAT_0054e620;
  auVar6 = vshufps_avx(auVar14._0_16_,auVar9,0x24);
  auVar6 = vinsertps_avx(auVar6,auVar16._0_16_,0x20);
  auVar15._8_4_ = 0x4cbebc20;
  auVar15._0_8_ = 0x4cbebc204cbebc20;
  auVar15._12_4_ = 0x4cbebc20;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x =
       dndvs.super_Tuple3<pbrt::Normal3,_float>.x;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y =
       dndvs.super_Tuple3<pbrt::Normal3,_float>.y;
  auVar10 = vpermi2ps_avx512vl(auVar10,auVar9,auVar20._0_16_);
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z =
       dndvs.super_Tuple3<pbrt::Normal3,_float>.z;
  do {
    auVar17._0_4_ = auVar6._0_4_ * auVar6._0_4_;
    auVar17._4_4_ = auVar6._4_4_ * auVar6._4_4_;
    auVar17._8_4_ = auVar6._8_4_ * auVar6._8_4_;
    auVar17._12_4_ = auVar6._12_4_ * auVar6._12_4_;
    auVar9 = vhaddps_avx(auVar17,auVar17);
    auVar11 = vshufpd_avx(auVar17,auVar17,1);
    if (auVar9._0_4_ + auVar11._0_4_ <= 1e+16) {
      auVar19._0_4_ = auVar10._0_4_ * auVar10._0_4_;
      auVar19._4_4_ = auVar10._4_4_ * auVar10._4_4_;
      auVar19._8_4_ = auVar10._8_4_ * auVar10._8_4_;
      auVar19._12_4_ = auVar10._12_4_ * auVar10._12_4_;
      auVar11 = vshufps_avx(auVar17,auVar17,0xff);
      auVar9 = vmovshdup_avx(auVar19);
      if (auVar11._0_4_ + auVar19._0_4_ + auVar9._0_4_ <= 1e+16) {
        return;
      }
    }
    auVar6 = vdivps_avx(auVar6,auVar15);
    auVar10 = vdivps_avx(auVar10,auVar15);
    (this->shading).dpdu = (Vector3f)auVar6._0_12_;
    (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)auVar6._12_4_;
    uVar3 = vmovlps_avx(auVar10);
    (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)uVar3;
    (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)uVar3 >> 0x20);
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    void SetShadingGeometry(Normal3f ns, Vector3f dpdus, Vector3f dpdvs, Normal3f dndus,
                            Normal3f dndvs, bool orientationIsAuthoritative) {
        // Compute _shading.n_ for _SurfaceInteraction_
        shading.n = ns;
        DCHECK_NE(shading.n, Normal3f(0, 0, 0));
        if (orientationIsAuthoritative)
            n = FaceForward(n, shading.n);
        else
            shading.n = FaceForward(shading.n, n);

        // Initialize _shading_ partial derivative values
        shading.dpdu = dpdus;
        shading.dpdv = dpdvs;
        shading.dndu = dndus;
        shading.dndv = dndvs;
        while (LengthSquared(shading.dpdu) > 1e16f ||
               LengthSquared(shading.dpdv) > 1e16f) {
            shading.dpdu /= 1e8f;
            shading.dpdv /= 1e8f;
        }
    }